

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_resolve_merge_key_populate(fy_document *fyd,fy_node *fyn,fy_node_pair *fynp,fy_node *fynm)

{
  _Bool _Var1;
  fy_node_pair *_n;
  fy_node *pfVar2;
  fy_node_pair *fynpn;
  fy_node_pair *fynpi;
  fy_node *fynm_local;
  fy_node_pair *fynp_local;
  fy_node *fyn_local;
  fy_document *fyd_local;
  
  if (fyd == (fy_document *)0x0) {
    fyd_local._4_4_ = -1;
  }
  else if ((((fyn == (fy_node *)0x0) || (fynp == (fy_node_pair *)0x0)) || (fynm == (fy_node *)0x0))
          || (((fyn->field_0x34 & 3) != 2 || ((fynm->field_0x34 & 3) != 2)))) {
    fy_document_diag(fyd,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,0x9f2,"fy_resolve_merge_key_populate","bad inputs to %s",
                     "fy_resolve_merge_key_populate");
LAB_00133a3f:
    fyd_local._4_4_ = -1;
  }
  else {
    for (fynpn = fy_node_pair_list_head(&(fynm->field_12).mapping); fynpn != (fy_node_pair *)0x0;
        fynpn = fy_node_pair_next(&(fynm->field_12).mapping,fynpn)) {
      _Var1 = fy_node_mapping_key_is_duplicate(fyn,fynpn->key);
      if (!_Var1) {
        _n = fy_node_pair_alloc(fyd);
        if (_n == (fy_node_pair *)0x0) {
          fy_document_diag(fyd,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                           ,0x9fd,"fy_resolve_merge_key_populate","fy_node_pair_alloc() failed");
          goto LAB_00133a3f;
        }
        pfVar2 = fy_node_copy(fyd,fynpn->key);
        _n->key = pfVar2;
        pfVar2 = fy_node_copy(fyd,fynpn->value);
        _n->value = pfVar2;
        fy_node_pair_list_insert_after(&(fyn->field_12).mapping,fynp,_n);
        if (fyn->xl != (fy_accel *)0x0) {
          fy_accel_insert(fyn->xl,_n->key,_n);
        }
      }
    }
    fyd_local._4_4_ = 0;
  }
  return fyd_local._4_4_;
}

Assistant:

static int fy_resolve_merge_key_populate(struct fy_document *fyd, struct fy_node *fyn,
                                         struct fy_node_pair *fynp, struct fy_node *fynm) {
    struct fy_node_pair *fynpi, *fynpn;

    if (!fyd)
        return -1;

    fyd_error_check(fyd,
                    fyn && fynp && fynm && fyn->type == FYNT_MAPPING && fynm->type == FYNT_MAPPING,
                    err_out, "bad inputs to %s", __func__);

    for (fynpi = fy_node_pair_list_head(&fynm->mapping); fynpi;
         fynpi = fy_node_pair_next(&fynm->mapping, fynpi)) {

        /* make sure we don't override an already existing key */
        if (fy_node_mapping_key_is_duplicate(fyn, fynpi->key))
            continue;

        fynpn = fy_node_pair_alloc(fyd);
        fyd_error_check(fyd, fynpn, err_out,
                        "fy_node_pair_alloc() failed");

        fynpn->key = fy_node_copy(fyd, fynpi->key);
        fynpn->value = fy_node_copy(fyd, fynpi->value);

        fy_node_pair_list_insert_after(&fyn->mapping, fynp, fynpn);
        if (fyn->xl)
            fy_accel_insert(fyn->xl, fynpn->key, fynpn);
    }

    return 0;

    err_out:
    return -1;
}